

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PoolingLayerParams::InternalSwap
          (PoolingLayerParams *this,PoolingLayerParams *other)

{
  RepeatedField<unsigned_long> *pRVar1;
  RepeatedField<unsigned_long> *pRVar2;
  int iVar3;
  uint32_t uVar4;
  intptr_t iVar5;
  PoolingPaddingTypeUnion PVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  LogMessage *pLVar14;
  LogFinisher local_61;
  LogMessage local_60;
  
  iVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar5;
  pRVar1 = &this->kernelsize_;
  pRVar2 = &other->kernelsize_;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    iVar9 = pRVar1->current_size_;
    iVar10 = pRVar1->total_size_;
    pvVar7 = (this->kernelsize_).arena_or_elements_;
    iVar3 = pRVar2->total_size_;
    pvVar8 = (other->kernelsize_).arena_or_elements_;
    pRVar1->current_size_ = pRVar2->current_size_;
    pRVar1->total_size_ = iVar3;
    (this->kernelsize_).arena_or_elements_ = pvVar8;
    pRVar2->current_size_ = iVar9;
    pRVar2->total_size_ = iVar10;
    (other->kernelsize_).arena_or_elements_ = pvVar7;
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  else {
    iVar9 = pRVar1->current_size_;
    iVar10 = pRVar1->total_size_;
    pvVar7 = (this->kernelsize_).arena_or_elements_;
    iVar3 = pRVar2->total_size_;
    pvVar8 = (other->kernelsize_).arena_or_elements_;
    pRVar1->current_size_ = pRVar2->current_size_;
    pRVar1->total_size_ = iVar3;
    (this->kernelsize_).arena_or_elements_ = pvVar8;
    pRVar2->current_size_ = iVar9;
    pRVar2->total_size_ = iVar10;
    (other->kernelsize_).arena_or_elements_ = pvVar7;
  }
  iVar9 = (this->stride_).current_size_;
  iVar10 = (this->stride_).total_size_;
  pvVar7 = (this->stride_).arena_or_elements_;
  iVar3 = (other->stride_).total_size_;
  pvVar8 = (other->stride_).arena_or_elements_;
  (this->stride_).current_size_ = (other->stride_).current_size_;
  (this->stride_).total_size_ = iVar3;
  (this->stride_).arena_or_elements_ = pvVar8;
  (other->stride_).current_size_ = iVar9;
  (other->stride_).total_size_ = iVar10;
  (other->stride_).arena_or_elements_ = pvVar7;
  iVar3 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar3;
  bVar12 = this->avgpoolexcludepadding_;
  bVar13 = this->globalpooling_;
  bVar11 = other->globalpooling_;
  this->avgpoolexcludepadding_ = other->avgpoolexcludepadding_;
  this->globalpooling_ = bVar11;
  other->avgpoolexcludepadding_ = bVar12;
  other->globalpooling_ = bVar13;
  PVar6 = this->PoolingPaddingType_;
  this->PoolingPaddingType_ = other->PoolingPaddingType_;
  other->PoolingPaddingType_ = PVar6;
  uVar4 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar4;
  return;
}

Assistant:

void PoolingLayerParams::InternalSwap(PoolingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(PoolingLayerParams, globalpooling_)
      + sizeof(PoolingLayerParams::globalpooling_)
      - PROTOBUF_FIELD_OFFSET(PoolingLayerParams, type_)>(
          reinterpret_cast<char*>(&type_),
          reinterpret_cast<char*>(&other->type_));
  swap(PoolingPaddingType_, other->PoolingPaddingType_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}